

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::relative_pose::modules::fivept_kneip_main
               (Matrix<double,_3,_5,_0,_3,_5> *f1,Matrix<double,_3,_5,_0,_3,_5> *f2,
               rotations_t *rotations)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Matrix<double,_3,_5,_0,_3,_5> *pMVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *this;
  long lVar28;
  ulong uVar29;
  double *pdVar30;
  long lVar31;
  double *pdVar32;
  uint i;
  iterator iVar33;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  long lVar34;
  double *pdVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  Packet2d mask;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 extraout_var [56];
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  double dVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  double dVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  double dVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  double dVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  double dVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  c_2;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  c_1;
  rotation_t finalRotation;
  Matrix3d temp2;
  Matrix3d temp1;
  Matrix<std::complex<double>,_20,_1,_0,_20,_1> D;
  Matrix<std::complex<double>,_20,_20,_0,_20,_20> V;
  Matrix<double,_20,_20,_0,_20,_20> M;
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> Eig;
  Matrix<double,_66,_197,_0,_66,_197> groebnerMatrix;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  vStack_20600;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  vStack_205e0;
  Matrix<double,_3,_3,_0,_3,_3> MStack_205c0;
  undefined1 auStack_20560 [16];
  undefined1 auStack_20550 [16];
  undefined1 auStack_20540 [16];
  undefined1 auStack_20530 [16];
  undefined1 auStack_20520 [16];
  double *pdStack_20510;
  double dStack_20508;
  undefined1 auStack_20500 [16];
  double dStack_204f0;
  double dStack_204e8;
  double dStack_204e0;
  double dStack_204d8;
  double dStack_204d0;
  double dStack_204c8;
  double dStack_204c0;
  undefined1 auStack_20480 [16];
  double dStack_20470;
  double dStack_20468;
  double dStack_20460;
  double dStack_20458;
  double dStack_20450;
  double dStack_20448;
  double dStack_20440;
  double dStack_20410;
  ulong uStack_20408;
  undefined1 auStack_20400 [16];
  undefined1 auStack_203f0 [16];
  undefined1 auStack_203e0 [16];
  undefined1 auStack_203d0 [16];
  undefined1 auStack_203c0 [16];
  undefined1 auStack_203b0 [16];
  undefined1 auStack_203a0 [16];
  undefined1 auStack_20390 [16];
  undefined1 auStack_20380 [16];
  double dStack_20370;
  ulong uStack_20368;
  undefined1 auStack_20360 [16];
  undefined1 auStack_20350 [16];
  undefined1 auStack_20340 [16];
  undefined1 auStack_20330 [16];
  undefined1 auStack_20320 [16];
  undefined1 auStack_20310 [16];
  undefined1 auStack_20300 [16];
  undefined1 auStack_202f0 [16];
  undefined1 auStack_202e0 [16];
  undefined1 auStack_202d0 [16];
  undefined1 auStack_202c0 [16];
  undefined1 auStack_202b0 [16];
  undefined1 auStack_202a0 [16];
  undefined1 auStack_20290 [16];
  undefined1 auStack_20280 [16];
  undefined1 auStack_20270 [16];
  undefined1 auStack_20260 [16];
  undefined1 auStack_20250 [16];
  undefined1 auStack_20240 [16];
  undefined1 auStack_20230 [16];
  undefined1 auStack_20220 [16];
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *pvStack_20208;
  undefined1 auStack_20200 [16];
  undefined1 auStack_201f0 [16];
  undefined1 auStack_201e0 [16];
  undefined1 auStack_201d0 [16];
  undefined1 auStack_201c0 [16];
  undefined8 uStack_201b0;
  undefined8 uStack_201a8;
  ulong uStack_201a0;
  ulong uStack_20198;
  undefined1 auStack_20190 [16];
  double dStack_20180;
  ulong uStack_20178;
  undefined1 auStack_20170 [16];
  undefined1 auStack_20160 [16];
  undefined1 auStack_20150 [16];
  double dStack_20140;
  ulong uStack_20138;
  undefined1 auStack_20130 [16];
  ulong uStack_20120;
  ulong uStack_20118;
  undefined1 auStack_20110 [16];
  undefined1 auStack_20100 [8];
  ulong auStack_200f8 [39];
  EigenvectorsType EStack_1ffc0;
  EigenBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> aEStack_1e6c0 [8];
  double adStack_1e6b8 [29];
  undefined8 uStack_1e5d0;
  undefined8 uStack_1e528;
  undefined8 uStack_1e480;
  undefined8 uStack_1e3d8;
  undefined8 uStack_1e330;
  undefined8 uStack_1e288;
  undefined8 uStack_1e1e0;
  undefined8 uStack_1e138;
  undefined8 uStack_1e090;
  undefined8 uStack_1dae8;
  double adStack_1da50 [2];
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> EStack_1da40;
  Matrix<double,_66,_197,_0,_66,_197> MStack_196d0;
  
  memset(&MStack_196d0,0,0x19650);
  dStack_204c0 = 0.0;
  _auStack_20480 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  _auStack_20500 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  dStack_20440 = 0.0;
  vStack_205e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  vStack_205e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_205e0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
            ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
              *)&vStack_205e0,(iterator)0x0,(Matrix<double,_3,_3,_0,_3,_3> *)auStack_20480);
  if (vStack_205e0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      vStack_205e0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)&vStack_205e0,
               (iterator)
               vStack_205e0.
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20480);
    iVar33._M_current =
         vStack_205e0.
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((vStack_205e0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
         dStack_20440;
    auVar64 = vmovdqa64_avx512f(_auStack_20480);
    auVar64 = vmovdqu64_avx512f(auVar64);
    *(undefined1 (*) [64])
     ((vStack_205e0.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->
     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array = auVar64;
    iVar33._M_current =
         vStack_205e0.
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    vStack_205e0.
    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar33._M_current;
  }
  if (iVar33._M_current ==
      vStack_205e0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)&vStack_205e0,iVar33,(Matrix<double,_3,_3,_0,_3,_3> *)auStack_20480);
  }
  else {
    ((iVar33._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
    m_data.array[8] = dStack_20440;
    auVar64 = vmovdqa64_avx512f(_auStack_20480);
    auVar64 = vmovdqu64_avx512f(auVar64);
    *(undefined1 (*) [64])
     ((iVar33._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
     m_data.array = auVar64;
    vStack_205e0.
    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar33._M_current + 1;
  }
  vStack_20600.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_20600.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_20600.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  std::
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
            ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
              *)&vStack_20600,(iterator)0x0,(Matrix<double,_3,_3,_0,_3,_3> *)auStack_20500);
  if (vStack_20600.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      vStack_20600.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)&vStack_20600,
               (iterator)
               vStack_20600.
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20500);
    iVar33._M_current =
         vStack_20600.
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((vStack_20600.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
         dStack_204c0;
    auVar64 = vmovdqa64_avx512f(_auStack_20500);
    auVar64 = vmovdqu64_avx512f(auVar64);
    *(undefined1 (*) [64])
     ((vStack_20600.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->
     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array = auVar64;
    iVar33._M_current =
         vStack_20600.
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    vStack_20600.
    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar33._M_current;
  }
  if (iVar33._M_current ==
      vStack_20600.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)&vStack_20600,iVar33,(Matrix<double,_3,_3,_0,_3,_3> *)auStack_20500);
  }
  else {
    ((iVar33._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
    m_data.array[8] = dStack_204c0;
    auVar64 = vmovdqa64_avx512f(_auStack_20500);
    auVar64 = vmovdqu64_avx512f(auVar64);
    *(undefined1 (*) [64])
     ((iVar33._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
     m_data.array = auVar64;
    vStack_20600.
    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar33._M_current + 1;
  }
  uVar37 = 2;
  uVar36 = 1;
  lVar34 = 0;
  uVar29 = 0;
  pMVar15 = f1;
  pdStack_20510 = (double *)f2;
  pvStack_20208 =
       (vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        *)rotations;
  do {
    pdVar35 = pdStack_20510 + 3;
    pdVar32 = (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
              m_data.array + 3;
    auStack_20550._0_8_ = pdVar32;
    auStack_20520._0_8_ = uVar29;
    auStack_20530._0_8_ = uVar37;
    auStack_20560._0_8_ = uVar36;
    pdStack_20510 = pdVar35;
    if (uVar29 < 4) {
      lVar31 = uVar29 * 0x18;
      auStack_20540._0_8_ = lVar31;
      do {
        pdVar30 = (double *)
                  ((long)(f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                         m_storage.m_data.array + lVar31);
        dVar102 = *pdVar30;
        dVar131 = pdVar30[1];
        dVar74 = *(double *)
                  ((long)(f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                         m_storage.m_data.array + lVar31 + 0x10);
        lVar28 = 2;
        pdVar30 = pdVar32;
        do {
          dVar1 = *pdVar30;
          pdVar30 = pdVar30 + 1;
          adStack_1da50[lVar28] = dVar102 * dVar1;
          adStack_1da50[lVar28 + 1] = dVar131 * dVar1;
          EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
          m_storage.m_data.array[lVar28] = dVar74 * dVar1;
          lVar28 = lVar28 + 3;
        } while (lVar28 != 0xb);
        auStack_20480._8_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[1];
        auStack_20480._0_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[0];
        dStack_20470 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[2];
        dStack_20468 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[3];
        dStack_20460 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[4];
        dStack_20458 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[5];
        dStack_20450 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[6];
        dStack_20448 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[7];
        dStack_20440 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[8];
        pdVar30 = (double *)
                  ((long)(f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                         m_storage.m_data.array + lVar31);
        dVar102 = *pdVar30;
        dVar131 = pdVar30[1];
        dVar74 = *(double *)
                  ((long)(f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                         m_storage.m_data.array + lVar31 + 0x10);
        lVar28 = 2;
        pdVar30 = pdVar35;
        do {
          dVar1 = *pdVar30;
          pdVar30 = pdVar30 + 1;
          auVar39._0_8_ = dVar102 * dVar1;
          auVar39._8_8_ = dVar131 * dVar1;
          *(undefined1 (*) [16])(adStack_1da50 + lVar28) = auVar39;
          EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
          m_storage.m_data.array[lVar28] = dVar74 * dVar1;
          lVar28 = lVar28 + 3;
        } while (lVar28 != 0xb);
        auVar64._8_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[1];
        auVar64._0_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[0];
        auVar64._16_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[2];
        auVar64._24_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[3];
        auVar64._32_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[4];
        auVar64._40_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[5];
        auVar64._48_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[6];
        auVar64._56_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[7];
        auVar64 = vmovdqu64_avx512f(auVar64);
        _auStack_20500 = vmovdqa64_avx512f(auVar64);
        dStack_204c0 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[8];
        if (uVar36 < 4) {
          lVar34 = (long)(int)lVar34;
          auStack_20220._0_8_ = uVar37;
          do {
            dVar74 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                     m_data.array[uVar37 * 3];
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
                 = dVar74 * (double)auStack_20480._0_8_;
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
                 = dVar74 * (double)auStack_20480._8_8_;
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
                 = dVar74 * dStack_20470;
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
                 = dVar74 * dStack_20468;
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
                 = dVar74 * dStack_20460;
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
                 = dVar74 * dStack_20458;
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
                 = dVar74 * dStack_20450;
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
                 = dVar74 * dStack_20448;
            ((vStack_205e0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
                 = dVar74 * dStack_20440;
            dVar74 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                     m_data.array[uVar37 * 3 + 1];
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)auStack_20480._0_8_ * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)auStack_20480._8_8_ * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
                 dVar74 * dStack_20470;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
                 dVar74 * dStack_20468;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
                 dVar74 * dStack_20460;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
                 dVar74 * dStack_20458;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
                 dVar74 * dStack_20450;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 dVar74 * dStack_20448;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 dVar74 * dStack_20440;
            dVar74 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                     m_data.array[uVar37 * 3 + 2];
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)auStack_20480._0_8_ * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)auStack_20480._8_8_ * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
                 dStack_20470 * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
                 dStack_20468 * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
                 dStack_20460 * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
                 dStack_20458 * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
                 dStack_20450 * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 dStack_20448 * dVar74;
            vStack_205e0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 dStack_20440 * dVar74;
            dVar74 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                     m_data.array[uVar37 * 3];
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
                 = dVar74 * (double)auStack_20500._0_8_;
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
                 = dVar74 * (double)auStack_20500._8_8_;
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
                 = dVar74 * dStack_204f0;
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
                 = dVar74 * dStack_204e8;
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
                 = dVar74 * dStack_204e0;
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
                 = dVar74 * dStack_204d8;
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
                 = dVar74 * dStack_204d0;
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
                 = dVar74 * dStack_204c8;
            ((vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
                 = dVar74 * dStack_204c0;
            dVar74 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                     m_data.array[uVar37 * 3 + 1];
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)auStack_20500._0_8_ * dVar74;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)auStack_20500._8_8_ * dVar74;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
                 dVar74 * dStack_204f0;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
                 dVar74 * dStack_204e8;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
                 dVar74 * dStack_204e0;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
                 dVar74 * dStack_204d8;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
                 dVar74 * dStack_204d0;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 dVar74 * dStack_204c8;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 dVar74 * dStack_204c0;
            dVar74 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                     m_data.array[uVar37 * 3 + 2];
            auVar63._0_8_ = dStack_204f0 * dVar74;
            auVar63._8_8_ = dStack_204e8 * dVar74;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)auStack_20500._0_8_ * dVar74;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)auStack_20500._8_8_ * dVar74;
            *(undefined1 (*) [16])
             (vStack_20600.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             2) = auVar63;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
                 dStack_204e0 * dVar74;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
                 dStack_204d8 * dVar74;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
                 dStack_204d0 * dVar74;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 dStack_204c8 * dVar74;
            vStack_20600.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 dStack_204c0 * dVar74;
            fivept_kneip::initEpncpRowR
                      ((Matrix<double,_1,_197,_1,_1,_197> *)&EStack_1da40,&vStack_205e0,
                       &vStack_20600);
            auVar64 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar65 = vpbroadcastq_avx512f(ZEXT816(0xc5));
            auVar66 = vpbroadcastq_avx512f(ZEXT816(0x210));
            auVar67 = vpbroadcastq_avx512f(ZEXT816(8));
            lVar31 = 0;
            do {
              uVar29 = vpcmpuq_avx512f(auVar64,auVar65,1);
              auVar68 = vpmullq_avx512dq(auVar64,auVar66);
              auVar64 = vpaddq_avx512f(auVar64,auVar67);
              lVar28 = lVar31 * 8;
              auVar69._8_8_ =
                   (ulong)((byte)(uVar29 >> 1) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar28 + 8);
              auVar69._0_8_ =
                   (ulong)((byte)uVar29 & 1) *
                   (long)EStack_1da40.m_eivec.
                         super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                         m_data.array[lVar31];
              auVar69._16_8_ =
                   (ulong)((byte)(uVar29 >> 2) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar28 + 0x10);
              auVar69._24_8_ =
                   (ulong)((byte)(uVar29 >> 3) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar28 + 0x18);
              auVar69._32_8_ =
                   (ulong)((byte)(uVar29 >> 4) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar28 + 0x20);
              auVar69._40_8_ =
                   (ulong)((byte)(uVar29 >> 5) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar28 + 0x28);
              auVar69._48_8_ =
                   (ulong)((byte)(uVar29 >> 6) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar28 + 0x30);
              auVar69._56_8_ =
                   (uVar29 >> 7) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar28 + 0x38);
              lVar31 = lVar31 + 8;
              vscatterqpd_avx512f(ZEXT864(MStack_196d0.
                                          super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                                          .m_storage.m_data.array + lVar34) + auVar68,uVar29,auVar69
                                 );
            } while (lVar31 != 200);
            lVar34 = lVar34 + 1;
            bVar38 = uVar37 < 4;
            uVar37 = uVar37 + 1;
          } while (bVar38);
          lVar31 = auStack_20540._0_8_;
          uVar37 = auStack_20220._0_8_;
        }
        uVar36 = uVar36 + 1;
        uVar37 = uVar37 + 1;
        pdVar32 = pdVar32 + 3;
        pdVar35 = pdVar35 + 3;
      } while (uVar36 != 5);
    }
    uVar29 = auStack_20520._0_8_ + 1;
    uVar37 = auStack_20530._0_8_ + 1;
    uVar36 = auStack_20560._0_8_ + 1;
    pMVar15 = (Matrix<double,_3,_5,_0,_3,_5> *)auStack_20550._0_8_;
  } while (uVar29 != 5);
  fivept_kneip::initMatrix(&MStack_196d0);
  fivept_kneip::computeBasis(&MStack_196d0);
  memset(aEStack_1e6c0,0,0xc80);
  this = pvStack_20208;
  lVar34 = 0x40;
  pdVar32 = MStack_196d0.super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>.
            m_storage.m_data.array + 0x2ddd;
  do {
    dVar74 = pdVar32[-7];
    dVar102 = pdVar32[-6];
    dVar131 = pdVar32[-5];
    dVar1 = pdVar32[-4];
    dVar2 = pdVar32[-3];
    *(double *)(aEStack_1e6c0 + lVar34 + -0x40) = -pdVar32[-8];
    *(double *)(aEStack_1e6c0 + lVar34 + -0x38) = -dVar74;
    *(double *)(aEStack_1e6c0 + lVar34 + -0x30) = -dVar102;
    *(double *)(aEStack_1e6c0 + lVar34 + -0x28) = -dVar131;
    *(double *)(aEStack_1e6c0 + lVar34 + -0x20) = -dVar1;
    *(double *)(aEStack_1e6c0 + lVar34 + -0x18) = -dVar2;
    auVar89._0_8_ = -pdVar32[-2];
    auVar89._8_8_ = -pdVar32[-1];
    dVar74 = *pdVar32;
    dVar102 = pdVar32[1];
    pdVar32 = pdVar32 + 0x42;
    *(undefined1 (*) [16])(aEStack_1e6c0 + lVar34 + -0x10) = auVar89;
    *(double *)(aEStack_1e6c0 + lVar34) = -dVar74;
    *(double *)((long)adStack_1e6b8 + lVar34) = -dVar102;
    lVar34 = lVar34 + 0xa0;
  } while (lVar34 != 0xcc0);
  uStack_1e5d0 = 0x3ff0000000000000;
  uStack_1e528 = 0x3ff0000000000000;
  uStack_1e480 = 0x3ff0000000000000;
  uStack_1e3d8 = 0x3ff0000000000000;
  uStack_1e330 = 0x3ff0000000000000;
  uStack_1e288 = 0x3ff0000000000000;
  uStack_1e1e0 = 0x3ff0000000000000;
  uStack_1e138 = 0x3ff0000000000000;
  uStack_1e090 = 0x3ff0000000000000;
  uStack_1dae8 = 0x3ff0000000000000;
  EStack_1da40.m_realSchur.m_hess.m_isInitialized = false;
  EStack_1da40.m_realSchur.m_isInitialized = false;
  EStack_1da40.m_realSchur.m_matUisUptodate = false;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[1]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[1]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[2]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[2]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[3]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[3]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[4]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[4]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[5]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[5]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[6]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[6]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[7]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[7]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[8]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[8]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[9]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[9]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[10]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[10]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xb]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xb]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xc]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xc]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xd]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xd]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xe]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xe]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xf]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xf]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x10]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x10]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x11]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x11]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x12]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x12]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x13]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x13]._M_value._8_8_ = 0;
  EStack_1da40.m_isInitialized = false;
  EStack_1da40.m_eigenvectorsOk = false;
  EStack_1da40.m_realSchur.m_maxIters = -1;
  Eigen::EigenSolver<Eigen::Matrix<double,20,20,0,20,20>>::
  compute<Eigen::Matrix<double,20,20,0,20,20>>
            ((EigenSolver<Eigen::Matrix<double,20,20,0,20,20>> *)&EStack_1da40,aEStack_1e6c0,true);
  memcpy(auStack_20100,&EStack_1da40.m_eivalues,0x140);
  Eigen::EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>::eigenvectors
            (&EStack_1ffc0,&EStack_1da40);
  auStack_20200._8_8_ = 0x8000000000000000;
  auStack_20200._0_8_ = 0x8000000000000000;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  lVar34 = 0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [1] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [2] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [4] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 0.0;
  uStack_201b0 = 0x7fffffffffffffff;
  uStack_201a8 = 0x7fffffffffffffff;
  do {
    auVar41._8_8_ = 0;
    auVar41._0_8_ = auStack_200f8[lVar34 * 2];
    auVar40._8_8_ = 0x7fffffffffffffff;
    auVar40._0_8_ = 0x7fffffffffffffff;
    auVar39 = vandpd_avx512vl(auVar41,auVar40);
    if (auVar39._0_8_ < 0.1) {
      lVar31 = lVar34 * 0x140;
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)__divdc3();
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17f0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17e8),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1800),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17f8),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1810),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1808),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1820),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1818),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1830),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1828),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1840),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1838),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1850),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1848),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17c8));
      auVar65._0_8_ =
           (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1860),
                            *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x1858),
                            *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17d0),
                            *(undefined8 *)(aEStack_1e6c0 + lVar31 + -0x17c8));
      pdVar32 = pdStack_20510;
      auVar65._8_56_ = extraout_var;
      auVar51._8_8_ = 0;
      auVar51._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar55._8_8_ = 0;
      auVar55._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar43._8_8_ = 0;
      auVar43._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
      auVar39 = vunpcklpd_avx(auVar43,auVar51);
      auVar40 = vunpcklpd_avx(auVar55,auVar65._0_16_);
      auVar54._8_8_ = 0;
      auVar54._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5];
      auVar48._8_8_ = 0;
      auVar48._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1] +
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4] +
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar63 = vsqrtpd_avx(auVar48);
      auVar41 = vunpcklpd_avx(auVar42,auVar54);
      auVar49._8_8_ = 0;
      auVar49._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5] + auVar65._0_8_ * auVar65._0_8_ +
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
      auVar89 = vsqrtpd_avx(auVar49);
      auVar52._8_8_ = auVar63._0_8_;
      auVar52._0_8_ = auVar63._0_8_;
      auVar39 = vdivpd_avx(auVar39,auVar52);
      auVar50._8_8_ = auVar89._0_8_;
      auVar50._0_8_ = auVar89._0_8_;
      auVar63 = vunpcklpd_avx(auVar63,auVar89);
      auVar63 = vdivpd_avx(auVar40,auVar63);
      auVar89 = vdivpd_avx(auVar41,auVar50);
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = auVar63._0_8_;
      auVar41 = vshufpd_avx(auVar63,auVar63,3);
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = (double)vmovhpd_avx(auVar89);
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = auVar63._8_8_;
      auVar40 = vunpcklpd_avx(auVar39,auVar89);
      auVar42 = vshufpd_avx(auVar89,auVar89,1);
      auVar45._8_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar45._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3];
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = auVar40._0_8_;
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = auVar40._8_8_;
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = (double)vmovhpd_avx(auVar39);
      auVar43 = vshufpd_avx(auVar39,auVar39,1);
      dVar74 = auVar89._0_8_;
      auVar56._0_8_ =
           dVar74 * MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[7];
      auVar56._8_8_ =
           auVar89._8_8_ *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar40 = vmovhpd_avx(auVar45,MStack_205c0.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array[0]);
      auVar41 = vfmsub213pd_fma(auVar41,auVar39,auVar56);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar74 * auVar43._0_8_;
      auVar43 = vfmsub231sd_fma(auVar53,auVar39,auVar42);
      auVar46._0_8_ = auVar40._0_8_ * auVar41._0_8_;
      auVar46._8_8_ = auVar40._8_8_ * auVar41._8_8_;
      auVar40 = vshufpd_avx(auVar46,auVar46,1);
      auVar44._8_8_ = 0x7fffffffffffffff;
      auVar44._0_8_ = 0x7fffffffffffffff;
      auVar47._8_8_ = 0;
      auVar47._0_8_ =
           auVar43._0_8_ *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6] + (auVar40._0_8_ - auVar46._0_8_) + -1.0;
      auVar40 = vandpd_avx512vl(auVar47,auVar44);
      if (auVar40._0_8_ < 0.1) {
        auVar60._8_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[1];
        auVar60._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0];
        auVar61._8_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4];
        auVar61._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
        auStack_20220 = vshufpd_avx(auVar63,auVar63,1);
        auVar62._8_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7];
        auVar62._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
        auStack_20260._8_8_ =
             (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
             array[0];
        dVar102 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[2];
        auStack_20240._8_8_ = dVar102;
        auStack_20240._0_8_ = dVar102;
        dVar131 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[1];
        auStack_20250._8_8_ = dVar131;
        auStack_20250._0_8_ = dVar131;
        dVar1 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[1];
        dVar2 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[2];
        dVar3 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[4];
        dVar4 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[8];
        dVar5 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[0xe];
        auVar160._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0] * (double)auStack_20260._8_8_;
        auVar160._8_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[1] * (double)auStack_20260._8_8_;
        dVar149 = auStack_20220._0_8_;
        auStack_20260._0_8_ = auStack_20260._8_8_;
        auVar166._8_8_ = 0;
        auVar166._0_8_ = dVar2;
        auVar163._8_8_ = 0;
        auVar163._0_8_ = dVar1;
        auStack_20400._8_8_ = 0;
        auStack_20400._0_8_ = dVar3;
        auStack_203e0._8_8_ = 0;
        auStack_203e0._0_8_ = dVar4;
        auVar63 = vfmadd231pd_fma(auVar160,auVar61,auStack_20250);
        dVar88 = auVar42._0_8_;
        dVar6 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[5];
        auStack_20270._8_8_ = dVar6;
        auStack_20270._0_8_ = dVar6;
        auVar63 = vfmadd231pd_fma(auVar63,auVar62,auStack_20240);
        dVar7 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[4];
        auStack_20290._8_8_ = dVar7;
        auStack_20290._0_8_ = dVar7;
        dVar16 = dVar74 * (double)auStack_20260._8_8_ + dVar88 * dVar131 + dVar149 * dVar102;
        auStack_202a0._8_8_ =
             (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
             array[3];
        dVar102 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[0];
        auStack_20230._8_8_ = 0;
        auStack_20230._0_8_ = dVar102;
        auStack_20560 = vshufpd_avx512vl(auVar63,auVar63,1);
        auVar40 = vmulsd_avx512f(auVar63,auVar163);
        dVar131 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[0xc];
        auStack_20550._0_8_ = dVar16;
        auVar132._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0] * (double)auStack_202a0._8_8_;
        auVar132._8_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[1] * (double)auStack_202a0._8_8_;
        auStack_202a0._0_8_ = auStack_202a0._8_8_;
        auVar41 = vfmsub231sd_avx512f(auVar40,auStack_20230,auStack_20560);
        auStack_203c0._8_8_ = 0;
        auStack_203c0._0_8_ = dVar131;
        auVar40 = vfmadd231pd_fma(auVar132,auVar61,auStack_20290);
        auVar40 = vfmadd231pd_fma(auVar40,auVar62,auStack_20270);
        dVar8 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[8];
        auStack_202b0._8_8_ = dVar8;
        auStack_202b0._0_8_ = dVar8;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = dVar74 * (double)auStack_202a0._8_8_;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = dVar7 * dVar88 + dVar149 * dVar6;
        auVar42 = vaddsd_avx512f(auVar103,auVar119);
        dVar6 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[6];
        auStack_202e0._8_8_ = dVar6;
        auStack_202e0._0_8_ = dVar6;
        dVar7 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[7];
        auStack_202d0._8_8_ = dVar7;
        auStack_202d0._0_8_ = dVar7;
        auVar43 = vshufpd_avx512vl(auVar40,auVar40,1);
        vmovsd_avx512f(auVar42);
        auVar44 = vmulpd_avx512vl(auVar60,auStack_202e0);
        auVar44 = vfmadd231pd_avx512vl(auVar44,auVar61,auStack_202d0);
        auVar44 = vfmadd231pd_avx512vl(auVar44,auVar62,auStack_202b0);
        dVar9 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[0xb];
        auStack_20300._8_8_ = dVar9;
        auStack_20300._0_8_ = dVar9;
        auVar104._8_8_ = 0;
        auVar104._0_8_ = dVar74 * dVar6;
        auVar120._8_8_ = 0;
        auVar120._0_8_ = dVar7 * dVar88 + dVar149 * dVar8;
        auVar45 = vaddsd_avx512f(auVar104,auVar120);
        dVar7 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[9];
        auStack_20320._8_8_ = dVar7;
        auStack_20320._0_8_ = dVar7;
        dVar8 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[10];
        auStack_20310._8_8_ = dVar8;
        auStack_20310._0_8_ = dVar8;
        auVar46 = vshufpd_avx512vl(auVar44,auVar44,1);
        vmovsd_avx512f(auVar45);
        auVar47 = vmulpd_avx512vl(auVar60,auStack_20320);
        auVar47 = vfmadd231pd_avx512vl(auVar47,auVar61,auStack_20310);
        auVar47 = vfmadd231pd_avx512vl(auVar47,auVar62,auStack_20300);
        dVar17 = dVar8 * dVar88 + dVar149 * dVar9 + dVar74 * dVar7;
        dVar8 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[0xc];
        auStack_20350._8_8_ = dVar8;
        auStack_20350._0_8_ = dVar8;
        dVar9 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data.
                array[7];
        auStack_203d0._8_8_ = 0;
        auStack_203d0._0_8_ = dVar9;
        auVar48 = vshufpd_avx512vl(auVar47,auVar47,1);
        auVar49 = vmulpd_avx512vl(auVar60,auStack_20350);
        dVar159 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[0xd];
        auStack_20340._8_8_ = dVar159;
        auStack_20340._0_8_ = dVar159;
        auVar49 = vfmadd231pd_avx512vl(auVar49,auStack_20340,auVar61);
        dVar10 = (f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data
                 .array[0xe];
        auStack_20330._8_8_ = dVar10;
        auStack_20330._0_8_ = dVar10;
        dVar11 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data
                 .array[5];
        auVar150._8_8_ = 0;
        auVar150._0_8_ = dVar11;
        auVar49 = vfmadd231pd_avx512vl(auVar49,auStack_20330,auVar62);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = dVar88 * dVar159 + dVar149 * dVar10;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = dVar74 * dVar8;
        auVar50 = vaddsd_avx512f(auVar90,auVar70);
        dVar159 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[3];
        auStack_203a0._8_8_ = 0;
        auStack_203a0._0_8_ = dVar159;
        uVar37 = auStack_20200._0_8_;
        uVar29 = auStack_20200._8_8_;
        auVar51 = vmulsd_avx512f(auVar44,auStack_203d0);
        dStack_20370 = dVar16 * (double)((ulong)dVar102 ^ uVar37);
        auVar52 = vmulsd_avx512f(auVar40,auStack_20400);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = dStack_20370;
        auVar53 = vfmadd213sd_avx512f(auVar63,auVar166,auVar71);
        auVar72._0_8_ = (ulong)dVar159 ^ uVar37;
        auVar72._8_8_ = uVar29;
        auVar52 = vfmsub231sd_avx512f(auVar52,auStack_203a0,auVar43);
        dVar102 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[10];
        auVar54 = vmulsd_avx512f(auVar42,auVar72);
        auVar63 = vfmadd213sd_fma(auVar40,auVar150,auVar54);
        auStack_202c0._0_8_ = auVar54._0_8_;
        dVar159 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[6];
        auStack_20360._8_8_ = 0;
        auStack_20360._0_8_ = dVar159;
        auVar40 = vmulsd_avx512f(auVar41,auVar63);
        auStack_203f0._8_8_ = 0;
        auStack_203f0._0_8_ = dVar102;
        auVar40 = vfmsub231sd_fma(auVar40,auVar53,auVar52);
        auVar91._0_8_ = (ulong)dVar159 ^ uVar37;
        auVar91._8_8_ = uVar29;
        auVar42 = vfmsub231sd_avx512f(auVar51,auStack_20360,auVar46);
        dVar159 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                  m_data.array[9];
        auStack_20380._8_8_ = 0;
        auStack_20380._0_8_ = dVar159;
        auVar45 = vmulsd_avx512f(auVar45,auVar91);
        dVar10 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data
                 .array[0xd];
        auVar44 = vfmadd213sd_avx512f(auVar44,auStack_203e0,auVar45);
        auStack_20280._0_8_ = auVar45._0_8_;
        dVar88 = (f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.m_data
                 .array[0xb];
        auStack_203b0._8_8_ = 0;
        auStack_203b0._0_8_ = dVar88;
        auVar51 = vxorpd_avx512vl(auStack_203c0,auStack_20200);
        auVar55 = vmulsd_avx512f(auVar52,auVar44);
        dStack_20410 = dVar17 * (double)((ulong)dVar159 ^ uVar37);
        auVar115._8_8_ = 0;
        auVar115._0_8_ = dVar17;
        auVar56 = vmulsd_avx512f(auVar47,auStack_203f0);
        auStack_20390._0_8_ = dVar17;
        auVar55 = vfmsub231sd_avx512f(auVar55,auVar63,auVar42);
        auVar56 = vfmsub231sd_avx512f(auVar56,auStack_20380,auVar48);
        auVar51 = vmulsd_avx512f(auVar50,auVar51);
        auVar121._8_8_ = 0;
        auVar121._0_8_ = dStack_20410;
        auVar47 = vfmadd213sd_avx512f(auVar47,auStack_203b0,auVar121);
        auVar57 = vshufpd_avx512vl(auVar49,auVar49,1);
        auVar174._8_8_ = 0;
        auVar174._0_8_ = dVar10;
        auVar58 = vmulsd_avx512f(auVar49,auVar174);
        auVar176._8_8_ = 0;
        auVar176._0_8_ = dVar5;
        auVar49 = vfmadd213sd_avx512f(auVar49,auVar176,auVar51);
        auVar164._8_8_ = 0;
        auVar164._0_8_ = dVar131;
        auVar59 = vfmsub231sd_avx512f(auVar58,auVar164,auVar57);
        auVar58 = vmulsd_avx512f(auVar41,auVar44);
        auStack_202f0._0_8_ = auVar51._0_8_;
        auVar57 = vmulsd_avx512f(auVar57,auVar176);
        vmovsd_avx512f(auVar50);
        auVar60 = vmulsd_avx512f(auVar52,auVar47);
        auVar61 = vmulsd_avx512f(auVar41,auVar47);
        auVar62 = vfmsub231sd_avx512f(auVar58,auVar53,auVar42);
        auVar50 = vfmsub231sd_avx512f(auVar57,auVar174,auVar50);
        auVar52 = vmulsd_avx512f(auVar52,auVar49);
        auVar57 = vmulsd_avx512f(auVar41,auVar49);
        auVar41 = vfmsub231sd_fma(auVar60,auVar63,auVar56);
        auVar60 = vfmsub231sd_avx512f(auVar61,auVar53,auVar56);
        auVar63 = vfmsub231sd_fma(auVar52,auVar59,auVar63);
        auVar52 = vmulsd_avx512f(auVar42,auVar47);
        auVar53 = vfmsub231sd_avx512f(auVar57,auVar59,auVar53);
        auVar61 = vmulsd_avx512f(auVar42,auVar49);
        auVar49 = vmulsd_avx512f(auVar56,auVar49);
        auVar52 = vfmsub231sd_avx512f(auVar52,auVar44,auVar56);
        auVar43 = vmulsd_avx512f(auVar43,auVar150);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = dVar16;
        auVar110._8_8_ = 0;
        auVar110._0_8_ = (double)auStack_20560._0_8_ * dVar2;
        auVar42 = vfmsub231sd_fma(auVar110,auVar163,auVar57);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = auStack_20540._0_8_;
        auVar173._8_8_ = 0;
        auVar173._0_8_ = dVar3;
        auVar56 = vfmsub231sd_avx512f(auVar43,auVar173,auVar58);
        auVar44 = vfmsub231sd_avx512f(auVar61,auVar59,auVar44);
        auVar47 = vfmsub231sd_avx512f(auVar49,auVar47,auVar59);
        auVar23._8_8_ = uStack_201a8;
        auVar23._0_8_ = uStack_201b0;
        auVar49 = vmulsd_avx512f(auVar42,auVar55);
        auVar57 = vmulsd_avx512f(auVar56,auVar62);
        auVar182._8_8_ = 0;
        auVar182._0_8_ = dVar4;
        auVar43 = vmulsd_avx512f(auVar46,auVar182);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = pdStack_20510;
        auVar43 = vfmsub231sd_fma(auVar43,auStack_203d0,auVar59);
        auVar46 = vmulsd_avx512f(auVar48,auStack_203b0);
        auVar48 = vmulsd_avx512f(auVar56,auVar60);
        auVar167._8_8_ = 0;
        auVar167._0_8_ = dVar102;
        auVar46 = vfmsub231sd_avx512f(auVar46,auVar167,auVar115);
        auVar94._8_8_ = 0;
        auVar94._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        auVar58 = vmulsd_avx512f(auVar40,auVar46);
        auVar59 = vmulsd_avx512f(auVar40,auVar43);
        dVar102 = auVar50._0_8_;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = auVar49._0_8_ - auVar57._0_8_;
        auVar49 = vaddsd_avx512f(auVar59,auVar122);
        auVar57 = vmulsd_avx512f(auVar42,auVar41);
        auVar48 = vsubsd_avx512f(auVar57,auVar48);
        auVar49 = vandpd_avx512vl(auVar49,auVar23);
        auVar48 = vaddsd_avx512f(auVar58,auVar48);
        auVar57 = vmulsd_avx512f(auVar56,auVar53);
        auVar48 = vandpd_avx512vl(auVar48,auVar23);
        auVar48 = vaddsd_avx512f(auVar49,auVar48);
        auVar49 = vmulsd_avx512f(auVar42,auVar63);
        auVar49 = vsubsd_avx512f(auVar49,auVar57);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = auVar40._0_8_ * dVar102;
        auVar40 = vaddsd_avx512f(auVar134,auVar49);
        auVar49 = vmulsd_avx512f(auVar43,auVar60);
        auVar57 = vandpd_avx512vl(auVar40,auVar23);
        dVar131 = auVar52._0_8_;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = dVar131 * auVar42._0_8_;
        auVar40 = vsubsd_avx512f(auVar135,auVar49);
        auVar49 = vmulsd_avx512f(auVar62,auVar46);
        auVar52 = vmulsd_avx512f(auVar62,auVar50);
        auVar40 = vaddsd_avx512f(auVar49,auVar40);
        auVar49 = vmulsd_avx512f(auVar43,auVar53);
        auVar58 = vandpd_avx512vl(auVar40,auVar23);
        dVar159 = auVar44._0_8_;
        auVar40 = vmulsd_avx512f(auVar42,auVar47);
        auVar136._8_8_ = 0;
        auVar136._0_8_ = dVar159 * auVar42._0_8_;
        auVar42 = vsubsd_avx512f(auVar136,auVar49);
        auVar42 = vaddsd_avx512f(auVar52,auVar42);
        auVar44 = vandpd_avx512vl(auVar42,auVar23);
        auVar42 = vmulsd_avx512f(auVar46,auVar53);
        auVar49 = vmulsd_avx512f(auVar60,auVar50);
        auVar111._8_8_ = 0;
        auVar111._0_8_ = auVar49._0_8_ + (auVar40._0_8_ - auVar42._0_8_);
        auVar49 = vandpd_avx512vl(auVar111,auVar23);
        auVar40 = vmulsd_avx512f(auVar55,auVar46);
        auVar123._8_8_ = 0;
        auVar123._0_8_ = auVar40._0_8_ + (dVar131 * auVar56._0_8_ - auVar43._0_8_ * auVar41._0_8_);
        auVar52 = vandpd_avx512vl(auVar123,auVar23);
        auVar40 = vmulsd_avx512f(auVar56,auVar47);
        auVar42 = vmulsd_avx512f(auVar55,auVar50);
        auVar124._8_8_ = 0;
        auVar124._0_8_ = auVar42._0_8_ + (dVar159 * auVar56._0_8_ - auVar43._0_8_ * auVar63._0_8_);
        auVar50 = vandpd_avx512vl(auVar124,auVar23);
        auVar157._8_8_ = 0;
        auVar157._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8];
        auVar133._8_8_ = 0;
        auVar133._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
        auVar148._8_8_ = 0;
        auVar148._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7];
        auVar128._8_8_ = 0;
        auVar128._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4];
        auVar116._8_8_ = 0;
        auVar116._0_8_ = auVar41._0_8_ * dVar102 + (auVar40._0_8_ - auVar46._0_8_ * auVar63._0_8_);
        auVar53 = vandpd_avx512vl(auVar116,auVar23);
        auVar63 = vmulsd_avx512f(auVar43,auVar47);
        auVar125._8_8_ = 0;
        auVar125._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
        auVar92._8_8_ = 0;
        auVar92._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4] * dVar74;
        auVar42 = vfmsub231sd_fma(auVar92,auVar39,auVar94);
        auVar105._8_8_ = 0;
        auVar105._0_8_ = dVar131 * dVar102 + (auVar63._0_8_ - auVar46._0_8_ * dVar159);
        auVar43 = vandpd_avx512vl(auVar105,auVar23);
        auVar106._8_8_ = 0;
        auVar106._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0];
        auVar117._8_8_ = 0;
        auVar117._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
        auVar63 = vfmadd231sd_fma(auVar117,auVar106,auVar106);
        auVar137._8_8_ = 0;
        auVar137._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4];
        auVar40 = vfmadd231sd_fma(auVar137,auVar106,auVar39);
        auVar151._8_8_ = 0;
        auVar151._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        auVar41 = vfmadd231sd_fma(auVar151,auVar106,auVar89);
        auVar63 = vfmadd231sd_fma(auVar63,auVar125,auVar125);
        auVar40 = vfmadd231sd_fma(auVar40,auVar125,auVar148);
        auVar41 = vfmadd231sd_fma(auVar41,auVar125,auVar157);
        auVar126._8_8_ = 0;
        auVar126._0_8_ =
             auVar42._0_8_ -
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
        auVar42 = vandpd_avx512vl(auVar126,auVar23);
        auVar46 = vandpd_avx512vl(auVar40,auVar23);
        auVar41 = vandpd_avx512vl(auVar41,auVar23);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = auVar63._0_8_ + -1.0;
        auVar47 = vandpd_avx512vl(auVar118,auVar23);
        auVar152._8_8_ = 0;
        auVar152._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4];
        auVar63 = vfmadd231sd_fma(auVar152,auVar39,auVar39);
        auVar63 = vfmadd231sd_fma(auVar63,auVar148,auVar148);
        auVar153._8_8_ = 0;
        auVar153._0_8_ = auVar63._0_8_ + -1.0;
        auVar55 = vandpd_avx512vl(auVar153,auVar23);
        auVar154._8_8_ = 0;
        auVar154._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        auVar63 = vfmadd231sd_fma(auVar154,auVar39,auVar89);
        auVar75._8_8_ = 0;
        auVar75._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] * auVar39._0_8_;
        auVar40 = vfmsub231sd_fma(auVar75,auVar106,auVar128);
        auVar39 = vfmadd231sd_fma(auVar63,auVar148,auVar157);
        auVar107._8_8_ = 0;
        auVar107._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0];
        auVar63 = vfmsub231sd_fma(auVar107,auVar89,auVar133);
        auVar56 = vandpd_avx512vl(auVar39,auVar23);
        auVar76._8_8_ = 0;
        auVar76._0_8_ =
             auVar40._0_8_ -
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8];
        auVar40 = vandpd_avx512vl(auVar76,auVar23);
        auVar155._8_8_ = 0;
        auVar155._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        auVar39 = vfmadd231sd_fma(auVar155,auVar89,auVar89);
        auVar108._8_8_ = 0;
        auVar108._0_8_ =
             auVar63._0_8_ -
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7];
        auVar63 = vandpd_avx512vl(auVar108,auVar23);
        auVar39 = vfmadd231sd_fma(auVar39,auVar157,auVar157);
        auVar156._8_8_ = 0;
        auVar156._0_8_ = auVar39._0_8_ + -1.0;
        auVar39 = vandpd_avx512vl(auVar156,auVar23);
        auStack_20530 = auVar166;
        auStack_20520 = auVar163;
        if (auVar40._0_8_ +
            auVar63._0_8_ +
            auVar42._0_8_ +
            auVar39._0_8_ +
            auVar56._0_8_ +
            auVar55._0_8_ +
            auVar41._0_8_ +
            auVar46._0_8_ +
            auVar47._0_8_ +
            auVar43._0_8_ +
            auVar53._0_8_ +
            auVar50._0_8_ +
            auVar52._0_8_ +
            auVar44._0_8_ + auVar58._0_8_ + auVar48._0_8_ + auVar57._0_8_ + auVar49._0_8_ < 0.001) {
          auStack_20520._8_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4];
          auStack_20520._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3];
          auStack_20530._8_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7];
          auStack_20530._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6];
          auVar158._8_8_ = 0;
          auVar158._0_8_ = auStack_20540._0_8_;
          auVar177._8_8_ = 0;
          auVar177._0_8_ = dVar5;
          auVar129._8_8_ = 0;
          auVar129._0_8_ = auVar45._0_8_;
          auVar175._8_8_ = 0;
          auVar175._0_8_ = dVar10;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = dStack_20410;
          lVar31 = 0;
          auVar77._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * (double)auStack_20260._8_8_;
          auVar77._8_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * (double)auStack_20260._8_8_;
          pdStack_20510 =
               (double *)
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0];
          dStack_20508 = MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[1];
          auVar39 = vfmadd213pd_fma(auStack_20250,auStack_20520,auVar77);
          auVar63 = vfmadd213pd_fma(auStack_20240,auStack_20530,auVar39);
          auVar39 = vshufpd_avx(auVar63,auVar63,1);
          auVar165._8_8_ = 0;
          auVar165._0_8_ = dStack_20370;
          auVar43 = vfmadd231sd_avx512f(auVar165,auVar63,auVar166);
          auVar127._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar7;
          auVar127._8_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * dVar7;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = auVar39._0_8_ * (double)((ulong)dVar2 ^ uVar37);
          auVar162._8_8_ = 0;
          auVar162._0_8_ = dVar16;
          auVar44 = vfmadd213sd_avx512f(auVar162,auVar163,auVar78);
          auVar79._8_8_ = 0;
          auVar79._0_8_ = auVar63._0_8_ * (double)(uVar37 ^ (ulong)dVar1);
          auVar45 = vfmadd213sd_avx512f(auStack_20230,auVar39,auVar79);
          auVar80._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * (double)auStack_202a0._8_8_;
          auVar80._8_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * (double)auStack_202a0._8_8_;
          auVar63 = vfmadd213pd_fma(auStack_20310,auStack_20520,auVar127);
          auVar39 = vfmadd213pd_fma(auStack_20290,auStack_20520,auVar80);
          auVar40 = vfmadd213pd_fma(auStack_20270,auStack_20530,auVar39);
          auVar39 = vshufpd_avx(auVar40,auVar40,1);
          auVar183._8_8_ = 0;
          auVar183._0_8_ = auVar54._0_8_;
          auVar46 = vfmadd231sd_avx512f(auVar183,auVar40,auVar150);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = auVar39._0_8_ * (double)(uVar37 ^ (ulong)dVar11);
          auVar41 = vfmadd213sd_fma(auVar158,auStack_20400,auVar81);
          auVar82._8_8_ = 0;
          auVar82._0_8_ = auVar40._0_8_ * (double)(uVar37 ^ (ulong)dVar3);
          auVar47 = vfmadd213sd_avx512f(auStack_203a0,auVar39,auVar82);
          auVar83._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar6;
          auVar83._8_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * dVar6;
          auVar39 = vfmadd213pd_fma(auStack_202d0,auStack_20520,auVar83);
          auVar40 = vfmadd213pd_fma(auStack_202b0,auStack_20530,auVar39);
          auVar39 = vshufpd_avx(auVar40,auVar40,1);
          auVar42 = vfmadd231sd_fma(auVar129,auVar40,auStack_203e0);
          auVar84._8_8_ = 0;
          auVar84._0_8_ = auVar39._0_8_ * (double)(uVar37 ^ (ulong)dVar4);
          auVar168._8_8_ = 0;
          auVar168._0_8_ = pdVar32;
          auVar48 = vfmadd213sd_avx512f(auVar168,auStack_203d0,auVar84);
          auVar49 = vxorpd_avx512vl(auStack_203f0,auStack_20200);
          auVar85._8_8_ = 0;
          auVar85._0_8_ = auVar40._0_8_ * (double)(uVar37 ^ (ulong)dVar9);
          auVar50 = vfmadd213sd_avx512f(auStack_20360,auVar39,auVar85);
          auVar52 = vxorpd_avx512vl(auVar177,auStack_20200);
          auVar63 = vfmadd213pd_fma(auStack_20300,auStack_20530,auVar63);
          auVar39 = vmulsd_avx512f(auVar48,auVar43);
          auVar53 = vfmsub231sd_avx512f(auVar39,auVar44,auVar42);
          auVar39 = vshufpd_avx(auVar63,auVar63,1);
          auVar40 = vfmadd231sd_fma(auVar95,auVar63,auStack_203b0);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = auStack_20560._0_8_;
          auVar112._8_8_ = 0;
          auVar112._0_8_ = auVar39._0_8_ * (double)(uVar37 ^ (ulong)dVar88);
          auVar161._8_8_ = 0;
          auVar161._0_8_ = dVar17;
          auVar54 = vfmadd213sd_avx512f(auVar161,auStack_203f0,auVar112);
          auVar55 = vmulsd_avx512f(auVar50,auVar44);
          auVar113._8_8_ = 0;
          auVar113._0_8_ = auVar63._0_8_ * auVar49._0_8_;
          auVar49 = vfmadd213sd_avx512f(auStack_20380,auVar39,auVar113);
          auVar114._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar8;
          auVar114._8_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * dVar8;
          auStack_20230 = vfmsub231sd_avx512f(auVar55,auVar45,auVar48);
          auVar39 = vmulsd_avx512f(auVar54,auVar46);
          auVar63 = vmulsd_avx512f(auVar49,auVar44);
          auVar55 = vfmsub231sd_avx512f(auVar39,auVar41,auVar40);
          auStack_20280 = vfmsub231sd_avx512f(auVar63,auVar45,auVar54);
          auVar39 = vfmadd213pd_fma(auStack_20340,auStack_20520,auVar114);
          auVar63 = vmulsd_avx512f(auVar49,auVar41);
          auVar56 = vfmsub231sd_avx512f(auVar63,auVar47,auVar54);
          auVar63 = vfmadd213pd_fma(auStack_20330,auStack_20530,auVar39);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = auVar51._0_8_;
          auVar39 = vmulsd_avx512f(auVar42,auVar45);
          auStack_20560 = vfmsub231sd_avx512f(auVar39,auVar43,auVar50);
          auVar39 = vshufpd_avx(auVar63,auVar63,1);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = auVar39._0_8_ * auVar52._0_8_;
          auVar51 = vfmadd213sd_avx512f(auVar73,auVar175,auVar86);
          auVar52 = vfmadd231sd_avx512f(auVar93,auVar63,auVar177);
          auVar57 = vmulsd_avx512f(auVar40,auVar45);
          auVar58 = vmulsd_avx512f(auVar54,auVar43);
          auVar59 = vmulsd_avx512f(auVar50,auVar41);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = auVar63._0_8_ * (double)(uVar37 ^ (ulong)dVar10);
          auVar39 = vfmadd213sd_fma(auStack_203c0,auVar39,auVar87);
          auVar63 = vmulsd_avx512f(auVar46,auVar45);
          auStack_20290 = vfmsub231sd_avx512f(auVar58,auVar44,auVar40);
          auStack_20270 = vfmsub231sd_avx512f(auVar57,auVar43,auVar49);
          auStack_20330 = vfmsub231sd_avx512f(auVar59,auVar47,auVar48);
          auVar57 = vmulsd_avx512f(auVar52,auVar45);
          auVar58 = vmulsd_avx512f(auVar52,auVar47);
          auVar59 = vmulsd_avx512f(auVar51,auVar42);
          auStack_20540 = vfmsub231sd_avx512f(auVar63,auVar43,auVar47);
          auStack_202d0 = vfmsub231sd_avx512f(auVar57,auVar43,auVar39);
          auVar63 = vfmsub231sd_avx512f(auVar58,auVar46,auVar39);
          auVar57 = vmulsd_avx512f(auVar39,auVar48);
          auStack_20130 = vfmsub231sd_avx512f(auVar59,auVar52,auVar48);
          dStack_20370 = (double)(uVar37 ^ auStack_20330._0_8_);
          uStack_20368 = uVar29 ^ auStack_20330._8_8_;
          auStack_20380 = vxorpd_avx512vl(auVar55,auStack_20200);
          auVar58 = vmulsd_avx512f(auVar47,auVar44);
          auVar138._8_8_ = 0;
          auVar138._0_8_ = auVar41._0_8_ * auVar39._0_8_;
          auVar59 = vfmsub231sd_avx512f(auVar138,auVar51,auVar47);
          auVar57 = vfmsub231sd_avx512f(auVar57,auVar51,auVar50);
          auStack_20550 = vfmsub231sd_avx512f(auVar58,auVar45,auVar41);
          auVar58 = vmulsd_avx512f(auVar41,auVar43);
          auStack_201d0 = vfmsub231sd_avx512f(auVar58,auVar44,auVar46);
          auVar58 = vmulsd_avx512f(auVar39,auVar44);
          auStack_201e0 = vfmsub231sd_avx512f(auVar58,auVar51,auVar45);
          auVar43 = vmulsd_avx512f(auVar51,auVar43);
          auVar45 = vmulsd_avx512f(auVar48,auVar46);
          auStack_202e0 = vfmsub231sd_avx512f(auVar43,auVar52,auVar44);
          auVar43 = vmulsd_avx512f(auVar42,auVar47);
          auStack_20340 = vfmsub231sd_avx512f(auVar45,auVar41,auVar42);
          auVar44 = vmulsd_avx512f(auVar40,auVar47);
          auVar45 = vmulsd_avx512f(auVar39,auVar54);
          auStack_20320 = vfmsub231sd_avx512f(auVar43,auVar46,auVar50);
          auStack_201f0 = vfmsub231sd_avx512f(auVar44,auVar46,auVar49);
          auVar43 = vmulsd_avx512f(auVar51,auVar46);
          auVar44 = vmulsd_avx512f(auVar54,auVar42);
          auVar45 = vfmsub231sd_avx512f(auVar45,auVar51,auVar49);
          auStack_20400 = vfmsub231sd_avx512f(auVar44,auVar48,auVar40);
          auVar41 = vfmsub231sd_avx512f(auVar43,auVar52,auVar41);
          auVar43 = vmulsd_avx512f(auVar40,auVar50);
          auVar44 = vmulsd_avx512f(auVar49,auVar48);
          auVar46 = vmulsd_avx512f(auVar52,auVar49);
          auStack_203e0 = vfmsub231sd_avx512f(auVar43,auVar42,auVar49);
          auVar43 = vfmsub231sd_avx512f(auVar46,auVar40,auVar39);
          auVar40 = vmulsd_avx512f(auVar51,auVar40);
          auStack_203f0 = vfmsub231sd_avx512f(auVar44,auVar50,auVar54);
          auVar44 = vmulsd_avx512f(auVar52,auVar50);
          dStack_20410 = (double)(uVar37 ^ auStack_20400._0_8_);
          uStack_20408 = uVar29 ^ auStack_20400._8_8_;
          auStack_20160._0_8_ = uVar37 ^ auVar57._0_8_;
          auStack_20160._8_8_ = uVar29 ^ auVar57._8_8_;
          auStack_20170 = vfmsub231sd_avx512f(auVar40,auVar54,auVar52);
          auStack_20240._0_8_ = auVar53._0_8_ ^ uVar37;
          auVar39 = vfmsub231sd_avx512f(auVar44,auVar42,auVar39);
          auVar130._0_8_ = uVar37 ^ auStack_20540._0_8_;
          auVar130._8_8_ = uVar29 ^ auStack_20540._8_8_;
          auVar40 = vxorpd_avx512vl(auStack_20200,auStack_20550);
          auStack_20240._8_8_ = auVar53._8_8_ ^ uVar29;
          uStack_20120 = uVar37 ^ auStack_203f0._0_8_;
          uStack_20118 = uVar29 ^ auStack_203f0._8_8_;
          auStack_20250._8_8_ = auStack_20560._8_8_ ^ uVar29;
          auStack_20250._0_8_ = auStack_20560._0_8_ ^ uVar37;
          auStack_20260 = vxorpd_avx512vl(auStack_20230,auStack_20200);
          auStack_202a0 = vxorpd_avx512vl(auStack_20290,auStack_20200);
          dStack_20180 = (double)(uVar37 ^ auStack_20170._0_8_);
          uStack_20178 = uVar29 ^ auStack_20170._8_8_;
          auVar42 = vxorpd_avx512vl(auStack_201d0,auStack_20200);
          auStack_202b0 = vxorpd_avx512vl(auStack_20270,auStack_20200);
          auStack_20190 = vxorpd_avx512vl(auVar43,auStack_20200);
          dStack_20140 = (double)(auStack_20130._0_8_ ^ uVar37);
          uStack_20138 = auStack_20130._8_8_ ^ uVar29;
          auStack_202c0 = vxorpd_avx512vl(auStack_20280,auStack_20200);
          uStack_201a0 = uVar37 ^ auVar45._0_8_;
          uStack_20198 = uVar29 ^ auVar45._8_8_;
          auStack_202f0 = vxorpd_avx512vl(auStack_202e0,auStack_20200);
          auStack_20300 = vxorpd_avx512vl(auStack_202d0,auStack_20200);
          auStack_20390 = vxorpd_avx512vl(auStack_201f0,auStack_20200);
          auStack_20310 = vxorpd_avx512vl(auStack_201e0,auStack_20200);
          auStack_20350 = vxorpd_avx512vl(auStack_20340,auStack_20200);
          auStack_20360 = vxorpd_avx512vl(auStack_20320,auStack_20200);
          auStack_203b0 = vxorpd_avx512vl(auVar41,auStack_20200);
          auStack_203a0._0_8_ = auVar56._0_8_ ^ uVar37;
          auStack_203d0 = vxorpd_avx512vl(auVar59,auStack_20200);
          auStack_203a0._8_8_ = auVar56._8_8_ ^ uVar29;
          auStack_203c0._8_8_ = uVar29 ^ auVar63._8_8_;
          auStack_203c0._0_8_ = uVar37 ^ auVar63._0_8_;
          auStack_20110._0_8_ = auStack_203e0._0_8_ ^ uVar37;
          auStack_20110._8_8_ = auStack_203e0._8_8_ ^ uVar29;
          auStack_20150 = vxorpd_avx512vl(auVar39,auStack_20200);
          do {
            uVar37 = *(ulong *)((long)(f1->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                                      m_storage.m_data.array + lVar31 + 0x10);
            dVar74 = *(double *)
                      ((long)(f1->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                             m_storage.m_data.array + lVar31 + 8);
            auVar109._8_8_ = 0;
            auVar109._0_8_ = dVar74;
            uVar29 = *(ulong *)((long)(f1->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                                      m_storage.m_data.array + lVar31);
            auVar44 = vmulpd_avx512vl(auVar89,*(undefined1 (*) [16])
                                               ((long)(f2->
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>
                                                  ).m_storage.m_data.array + lVar31));
            auVar46 = vmulsd_avx512f(auVar109,auVar42);
            auVar178._8_8_ = 0;
            auVar178._0_8_ = uVar37;
            auVar47 = vmulsd_avx512f(auVar178,auVar130);
            auVar169._8_8_ = 0;
            auVar169._0_8_ = uVar29;
            auVar48 = vmulsd_avx512f(auVar169,auVar40);
            auVar46 = vfmadd231sd_avx512f(auVar46,auStack_20550,auVar178);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_201d0,auVar169);
            auVar48 = vfmadd231sd_avx512f(auVar48,auStack_20540,auVar109);
            auVar46 = vunpcklpd_avx512vl(auVar46,auVar47);
            auVar20._8_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[1];
            auVar20._0_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[0];
            auVar13._8_8_ = 0;
            auVar13._0_8_ =
                 *(ulong *)((long)(f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>)
                                  .m_storage.m_data.array + lVar31 + 0x10);
            auVar47 = vmovddup_avx512vl(auVar13);
            uVar12 = *(undefined8 *)
                      ((long)(f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                             m_storage.m_data.array + lVar31);
            auVar18._8_8_ = uVar12;
            auVar18._0_8_ = uVar12;
            auVar49 = vmulpd_avx512vl(auVar20,auVar18);
            uVar12 = *(undefined8 *)
                      ((long)(f2->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                             m_storage.m_data.array + lVar31 + 8);
            auVar19._8_8_ = uVar12;
            auVar19._0_8_ = uVar12;
            auVar49 = vfmadd231pd_avx512vl(auVar49,auStack_20520,auVar19);
            auVar50 = vshufpd_avx512vl(auVar44,auVar44,1);
            auVar49 = vfmadd231pd_avx512vl(auVar49,auVar47,auStack_20530);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = dVar149;
            auVar47 = vmulsd_avx512f(auVar47,auVar14);
            auVar47 = vaddsd_avx512f(auVar50,auVar47);
            auVar50 = vshufpd_avx512vl(auVar49,auVar49,1);
            auVar51 = vmulsd_avx512f(auVar49,auVar40);
            auVar44 = vaddsd_avx512f(auVar44,auVar47);
            auVar47 = vmulsd_avx512f(auVar50,auVar42);
            auVar51 = vfmadd231sd_avx512f(auVar51,auStack_20540,auVar50);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_20550,auVar44);
            auVar52 = vmulsd_avx512f(auVar44,auVar130);
            auVar52 = vfmadd231sd_avx512f(auVar52,auStack_201d0,auVar49);
            auVar47 = vunpcklpd_avx512vl(auVar47,auVar52);
            auVar46 = vmulpd_avx512vl(auVar46,auVar47);
            auStack_201c0 = auVar89;
            if (auVar48._0_8_ * auVar51._0_8_ + auVar46._0_8_ + auVar46._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar46 = vmulsd_avx512f(auVar50,auStack_20240);
            auVar179._8_8_ = 0;
            auVar179._0_8_ = uVar37;
            auVar47 = vmulsd_avx512f(auVar179,auStack_20250);
            dVar102 = auVar49._0_8_;
            auVar139._8_8_ = 0;
            auVar139._0_8_ = dVar74 * (double)auStack_20240._0_8_;
            auVar48 = vfmadd231sd_avx512f(auVar139,auStack_20230,auVar179);
            auVar51 = vfmadd231sd_avx512f(auVar46,auStack_20230,auVar44);
            auVar46 = vmulsd_avx512f(auVar44,auStack_20250);
            auVar170._8_8_ = 0;
            auVar170._0_8_ = uVar29;
            auVar47 = vfmadd231sd_avx512f(auVar47,auVar53,auVar170);
            auVar96._8_8_ = 0;
            auVar96._0_8_ = dVar102 * auStack_20260._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar96,auStack_20560,auVar50);
            auVar54 = vfmadd231sd_avx512f(auVar46,auVar53,auVar49);
            auVar46 = vunpcklpd_avx(auVar48,auVar47);
            auVar47 = vmulsd_avx512f(auVar170,auStack_20260);
            auVar48 = vunpcklpd_avx512vl(auVar51,auVar54);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_20560,auVar109);
            auVar46 = vmulpd_avx512vl(auVar46,auVar48);
            if (auVar47._0_8_ * auVar52._0_8_ + auVar46._0_8_ + auVar46._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar46 = vmulsd_avx512f(auVar50,auStack_202a0);
            auVar47 = vmulsd_avx512f(auVar179,auStack_202b0);
            auVar140._8_8_ = 0;
            auVar140._0_8_ = dVar74 * auStack_202a0._0_8_;
            auVar48 = vfmadd231sd_avx512f(auVar140,auStack_20280,auVar179);
            auVar51 = vfmadd231sd_avx512f(auVar46,auStack_20280,auVar44);
            auVar46 = vmulsd_avx512f(auVar44,auStack_202b0);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_20290,auVar170);
            auVar97._8_8_ = 0;
            auVar97._0_8_ = dVar102 * auStack_202c0._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar97,auStack_20270,auVar50);
            auVar54 = vfmadd231sd_avx512f(auVar46,auStack_20290,auVar49);
            auVar46 = vunpcklpd_avx(auVar48,auVar47);
            auVar47 = vmulsd_avx512f(auVar170,auStack_202c0);
            auVar48 = vunpcklpd_avx512vl(auVar51,auVar54);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_20270,auVar109);
            auVar46 = vmulpd_avx512vl(auVar46,auVar48);
            if (auVar47._0_8_ * auVar52._0_8_ + auVar46._0_8_ + auVar46._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar180._8_8_ = 0;
            auVar180._0_8_ = uVar37;
            auVar46 = vmulsd_avx512f(auVar180,auStack_20300);
            auVar47 = vmulsd_avx512f(auVar50,auStack_202f0);
            auVar48 = vmulsd_avx512f(auVar44,auStack_20300);
            auVar141._8_8_ = 0;
            auVar141._0_8_ = dVar74 * auStack_202f0._0_8_;
            auVar51 = vfmadd231sd_avx512f(auVar141,auStack_201e0,auVar180);
            auVar171._8_8_ = 0;
            auVar171._0_8_ = uVar29;
            auVar46 = vfmadd231sd_avx512f(auVar46,auStack_202e0,auVar171);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_201e0,auVar44);
            auVar48 = vfmadd231sd_avx512f(auVar48,auStack_202e0,auVar49);
            auVar98._8_8_ = 0;
            auVar98._0_8_ = dVar102 * auStack_20310._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar98,auStack_202d0,auVar50);
            auVar46 = vunpcklpd_avx(auVar51,auVar46);
            auVar51 = vmulsd_avx512f(auVar171,auStack_20310);
            auVar47 = vunpcklpd_avx512vl(auVar47,auVar48);
            auVar46 = vmulpd_avx512vl(auVar46,auVar47);
            auVar47 = vfmadd231sd_avx512f(auVar51,auStack_202d0,auVar109);
            if (auVar47._0_8_ * auVar52._0_8_ + auVar46._0_8_ + auVar46._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar22._8_8_ = uStack_20368;
            auVar22._0_8_ = dStack_20370;
            auVar46 = vmulsd_avx512f(auVar50,auStack_20350);
            auVar47 = vmulsd_avx512f(auVar180,auStack_20360);
            auVar142._8_8_ = 0;
            auVar142._0_8_ = dVar74 * auStack_20350._0_8_;
            auVar48 = vfmadd231sd_avx512f(auVar142,auStack_20330,auVar180);
            auVar51 = vfmadd231sd_avx512f(auVar46,auStack_20330,auVar44);
            auVar46 = vmulsd_avx512f(auVar44,auStack_20360);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_20340,auVar171);
            auVar99._8_8_ = 0;
            auVar99._0_8_ = dVar102 * dStack_20370;
            auVar52 = vfmadd231sd_avx512f(auVar99,auStack_20320,auVar50);
            auVar54 = vfmadd231sd_avx512f(auVar46,auStack_20340,auVar49);
            auVar46 = vunpcklpd_avx(auVar48,auVar47);
            auVar47 = vmulsd_avx512f(auVar171,auVar22);
            auVar48 = vunpcklpd_avx512vl(auVar51,auVar54);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_20320,auVar109);
            auVar46 = vmulpd_avx512vl(auVar46,auVar48);
            if (auVar47._0_8_ * auVar52._0_8_ + auVar46._0_8_ + auVar46._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar46 = vmulsd_avx512f(auVar180,auStack_20390);
            auVar47 = vmulsd_avx512f(auVar50,auStack_20380);
            auVar48 = vmulsd_avx512f(auVar44,auStack_20390);
            auVar143._8_8_ = 0;
            auVar143._0_8_ = dVar74 * auStack_20380._0_8_;
            auVar51 = vfmadd231sd_avx512f(auVar143,auVar56,auVar180);
            auVar46 = vfmadd231sd_avx512f(auVar46,auVar55,auVar171);
            auVar47 = vfmadd231sd_avx512f(auVar47,auVar56,auVar44);
            auVar48 = vfmadd231sd_avx512f(auVar48,auVar55,auVar49);
            auVar100._8_8_ = 0;
            auVar100._0_8_ = dVar102 * (double)auStack_203a0._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar100,auStack_201f0,auVar50);
            auVar46 = vunpcklpd_avx(auVar51,auVar46);
            auVar51 = vmulsd_avx512f(auVar171,auStack_203a0);
            auVar47 = vunpcklpd_avx512vl(auVar47,auVar48);
            auVar46 = vmulpd_avx512vl(auVar46,auVar47);
            auVar47 = vfmadd231sd_avx512f(auVar51,auStack_201f0,auVar109);
            if (auVar47._0_8_ * auVar52._0_8_ + auVar46._0_8_ + auVar46._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar46 = vmulsd_avx512f(auVar180,auStack_203c0);
            auVar47 = vmulsd_avx512f(auVar50,auStack_203b0);
            auVar48 = vmulsd_avx512f(auVar44,auStack_203c0);
            auVar144._8_8_ = 0;
            auVar144._0_8_ = dVar74 * auStack_203b0._0_8_;
            auVar51 = vfmadd231sd_avx512f(auVar144,auVar59,auVar180);
            auVar46 = vfmadd231sd_avx512f(auVar46,auVar41,auVar171);
            auVar47 = vfmadd231sd_avx512f(auVar47,auVar59,auVar44);
            auVar48 = vfmadd231sd_avx512f(auVar48,auVar41,auVar49);
            auVar101._8_8_ = 0;
            auVar101._0_8_ = dVar102 * auStack_203d0._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar101,auVar63,auVar50);
            auVar46 = vunpcklpd_avx(auVar51,auVar46);
            auVar51 = vmulsd_avx512f(auVar171,auStack_203d0);
            auVar47 = vunpcklpd_avx512vl(auVar47,auVar48);
            auVar47 = vmulpd_avx512vl(auVar46,auVar47);
            auVar46 = vfmadd231sd_fma(auVar51,auVar63,auVar109);
            if (auVar46._0_8_ * auVar52._0_8_ + auVar47._0_8_ + auVar47._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar21._8_8_ = uStack_20408;
            auVar21._0_8_ = dStack_20410;
            auVar27._8_8_ = uStack_20118;
            auVar27._0_8_ = uStack_20120;
            auVar46 = vmulsd_avx512f(auVar50,auVar21);
            auVar181._8_8_ = 0;
            auVar181._0_8_ = uVar37;
            auVar47 = vmulsd_avx512f(auVar181,auStack_20110);
            auVar145._8_8_ = 0;
            auVar145._0_8_ = dVar74 * dStack_20410;
            auVar48 = vfmadd231sd_avx512f(auVar145,auStack_203f0,auVar181);
            auVar51 = vfmadd231sd_avx512f(auVar46,auStack_203f0,auVar44);
            auVar46 = vmulsd_avx512f(auVar44,auStack_20110);
            auVar172._8_8_ = 0;
            auVar172._0_8_ = uVar29;
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_20400,auVar172);
            auVar52 = vfmadd231sd_avx512f(auVar46,auStack_20400,auVar49);
            auVar54 = vmulsd_avx512f(auVar49,auVar27);
            auVar46 = vunpcklpd_avx(auVar48,auVar47);
            auVar47 = vmulsd_avx512f(auVar172,auVar27);
            auVar48 = vfmadd231sd_avx512f(auVar54,auStack_203e0,auVar50);
            auVar51 = vunpcklpd_avx512vl(auVar51,auVar52);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_203e0,auVar109);
            auVar46 = vmulpd_avx512vl(auVar46,auVar51);
            if (auVar47._0_8_ * auVar48._0_8_ + auVar46._0_8_ + auVar46._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar26._8_8_ = uStack_20138;
            auVar26._0_8_ = dStack_20140;
            auVar46 = vmulsd_avx512f(auVar181,auStack_20150);
            auVar47 = vmulsd_avx512f(auVar50,auVar26);
            auVar48 = vmulsd_avx512f(auVar44,auStack_20150);
            auVar146._8_8_ = 0;
            auVar146._0_8_ = dVar74 * dStack_20140;
            auVar51 = vfmadd231sd_avx512f(auVar146,auVar57,auVar181);
            auVar46 = vfmadd231sd_avx512f(auVar46,auStack_20130,auVar172);
            auVar48 = vfmadd231sd_avx512f(auVar48,auStack_20130,auVar49);
            auVar47 = vfmadd231sd_avx512f(auVar47,auVar57,auVar44);
            auVar52 = vmulsd_avx512f(auVar49,auStack_20160);
            auVar52 = vfmadd231sd_avx512f(auVar52,auVar39,auVar50);
            auVar46 = vunpcklpd_avx(auVar51,auVar46);
            auVar51 = vmulsd_avx512f(auVar172,auStack_20160);
            auVar47 = vunpcklpd_avx512vl(auVar47,auVar48);
            auVar47 = vmulpd_avx512vl(auVar46,auVar47);
            auVar46 = vfmadd231sd_fma(auVar51,auVar39,auVar109);
            if (auVar46._0_8_ * auVar52._0_8_ + auVar47._0_8_ + auVar47._8_8_ < 0.0)
            goto LAB_00160cd2;
            auVar24._8_8_ = uStack_20198;
            auVar24._0_8_ = uStack_201a0;
            auVar25._8_8_ = uStack_20178;
            auVar25._0_8_ = dStack_20180;
            auVar46 = vmulsd_avx512f(auVar181,auStack_20190);
            auVar47 = vmulsd_avx512f(auVar44,auStack_20190);
            auVar46 = vfmadd231sd_avx512f(auVar46,auStack_20170,auVar172);
            auVar48 = vmulsd_avx512f(auVar172,auVar24);
            auVar147._8_8_ = 0;
            auVar147._0_8_ = dVar74 * dStack_20180;
            auVar51 = vfmadd231sd_avx512f(auVar147,auVar45,auVar181);
            auVar47 = vfmadd231sd_avx512f(auVar47,auStack_20170,auVar49);
            auVar49 = vmulsd_avx512f(auVar49,auVar24);
            auVar48 = vfmadd231sd_avx512f(auVar48,auVar43,auVar109);
            auVar52 = vmulsd_avx512f(auVar50,auVar25);
            auVar49 = vfmadd231sd_avx512f(auVar49,auVar43,auVar50);
            auVar46 = vunpcklpd_avx(auVar51,auVar46);
            auVar44 = vfmadd231sd_avx512f(auVar52,auVar45,auVar44);
            auVar48 = vmulsd_avx512f(auVar48,auVar49);
            auVar44 = vunpcklpd_avx512vl(auVar44,auVar47);
            if (auVar48._0_8_ + auVar46._0_8_ * auVar44._0_8_ + auVar46._8_8_ * auVar44._8_8_ < 0.0)
            goto LAB_00160cd2;
            lVar31 = lVar31 + 0x18;
          } while (lVar31 != 0x78);
          iVar33._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8);
          if (iVar33._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>(this,iVar33,&MStack_205c0);
          }
          else {
            ((iVar33._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array[8] =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[8];
            auVar66._8_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[1];
            auVar66._0_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[0];
            auVar66._16_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[2];
            auVar66._24_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[3];
            auVar66._32_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[4];
            auVar66._40_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[5];
            auVar66._48_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[6];
            auVar66._56_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[7];
            *(undefined1 (*) [64])
             ((iVar33._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
             m_storage.m_data.array = auVar66;
            *(long *)(this + 8) = *(long *)(this + 8) + 0x48;
          }
        }
      }
    }
LAB_00160cd2:
    lVar34 = lVar34 + 1;
    if (lVar34 == 0x14) {
      if (vStack_20600.
          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        free((void *)vStack_20600.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8]);
      }
      if (vStack_205e0.
          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        free((void *)vStack_205e0.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8]);
      }
      return;
    }
  } while( true );
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip_main(
    const Eigen::Matrix<double,3,5> & f1,
    const Eigen::Matrix<double,3,5> & f2,
    rotations_t & rotations )
{
  Eigen::Matrix<double,66,197> groebnerMatrix =
      Eigen::Matrix<double,66,197>::Zero();
  Eigen::Matrix3d temp1 = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d temp2 = Eigen::Matrix3d::Zero();
  std::vector<Eigen::Matrix3d, Eigen::aligned_allocator<Eigen::Matrix3d> > c_1;
  c_1.push_back(temp1);
  c_1.push_back(temp1);
  c_1.push_back(temp1);
  std::vector<Eigen::Matrix3d, Eigen::aligned_allocator<Eigen::Matrix3d> > c_2;
  c_2.push_back(temp2);
  c_2.push_back(temp2);
  c_2.push_back(temp2);

  int currentRow = 0;

  for( int firstFeat = 0; firstFeat < 5; firstFeat++ )
  {
    for( int secondFeat = firstFeat + 1; secondFeat < 5; secondFeat++ )
    {
      temp1 = f1.col(firstFeat)*f1.col(secondFeat).transpose();
      temp2 = f2.col(firstFeat)*f2.col(secondFeat).transpose();

      for( int thirdFeat = secondFeat + 1; thirdFeat < 5; thirdFeat++ )
      {
        c_1[0] = temp1 * f1(0,thirdFeat);
        c_1[1] = temp1 * f1(1,thirdFeat);
        c_1[2] = temp1 * f1(2,thirdFeat);
        c_2[0] = temp2 * f2(0,thirdFeat);
        c_2[1] = temp2 * f2(1,thirdFeat);
        c_2[2] = temp2 * f2(2,thirdFeat);

        groebnerMatrix.row(currentRow++) =
            fivept_kneip::initEpncpRowR( c_1, c_2 );
      }
    }
  }

  fivept_kneip::initMatrix(groebnerMatrix);
  fivept_kneip::computeBasis(groebnerMatrix);

  Eigen::Matrix<double,20,20> M = Eigen::Matrix<double,20,20>::Zero();
  M.block<10,20>(0,0) = -groebnerMatrix.block<10,20>(51,177);
  M(10,1) = 1.0;
  M(11,2) = 1.0;
  M(12,3) = 1.0;
  M(13,4) = 1.0;
  M(14,5) = 1.0;
  M(15,6) = 1.0;
  M(16,7) = 1.0;
  M(17,8) = 1.0;
  M(18,9) = 1.0;
  M(19,18) = 1.0;

  Eigen::EigenSolver< Eigen::Matrix<double,20,20> > Eig(M,true);
  Eigen::Matrix<std::complex<double>,20,1> D = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,20,20> V = Eig.eigenvectors();

  //Eigen::Matrix<std::complex<double>,9,1> tempVector;
  rotation_t finalRotation = Eigen::Matrix3d::Zero();
  for( unsigned int i = 0; i < 20; i++ )
  {
    std::complex<double> tempp;
    tempp = D[i];

    //check if we have a real solution
    if( fabs(tempp.imag()) < 0.1 )
    {
      tempp = V(18,i)/V(19,i);
      finalRotation(0,0) = tempp.real();// tempVector[0] = tempp;
      tempp = V(17,i)/V(19,i);
      finalRotation(0,1) = tempp.real();// tempVector[1] = tempp;
      tempp = V(16,i)/V(19,i);
      finalRotation(0,2) = tempp.real();// tempVector[2] = tempp;
      tempp = V(15,i)/V(19,i);
      finalRotation(1,0) = tempp.real();// tempVector[3] = tempp;
      tempp = V(14,i)/V(19,i);
      finalRotation(1,1) = tempp.real();// tempVector[4] = tempp;
      tempp = V(13,i)/V(19,i);
      finalRotation(1,2) = tempp.real();// tempVector[5] = tempp;
      tempp = V(12,i)/V(19,i);
      finalRotation(2,0) = tempp.real();// tempVector[6] = tempp;
      tempp = V(11,i)/V(19,i);
      finalRotation(2,1) = tempp.real();// tempVector[7] = tempp;
      tempp = V(10,i)/V(19,i);
      finalRotation(2,2) = tempp.real();// tempVector[8] = tempp;

      double tempNorm = finalRotation.row(1).norm();
      finalRotation.row(1) = finalRotation.row(1) / tempNorm;
      tempNorm = finalRotation.row(2).norm();
      finalRotation.row(2) = finalRotation.row(2) / tempNorm;

      //check if the normalized rotation matrix has determinant close enough to 1
      if( fabs( finalRotation.determinant() - 1.0 ) < 0.1 )
      {
        Eigen::Matrix3d eval;
        double totalEval = 0.0;
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(2).cross(finalRotation*f2.col(2));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(0,0)+
            finalRotation(0,1)*finalRotation(0,1)+
            finalRotation(0,2)*finalRotation(0,2)-1);
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(1,0)+
            finalRotation(0,1)*finalRotation(1,1)+
            finalRotation(0,2)*finalRotation(1,2));
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(2,0)+
            finalRotation(0,1)*finalRotation(2,1)+
            finalRotation(0,2)*finalRotation(2,2));
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(1,0)+
            finalRotation(1,1)*finalRotation(1,1)+
            finalRotation(1,2)*finalRotation(1,2)-1);
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(2,0)+
            finalRotation(1,1)*finalRotation(2,1)+
            finalRotation(1,2)*finalRotation(2,2));
        totalEval += fabs(
            finalRotation(2,0)*finalRotation(2,0)+
            finalRotation(2,1)*finalRotation(2,1)+
            finalRotation(2,2)*finalRotation(2,2)-1);
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(2,1)-
            finalRotation(2,0)*finalRotation(1,1)-finalRotation(0,2));
        totalEval += fabs(
            finalRotation(2,0)*finalRotation(0,1)-
            finalRotation(0,0)*finalRotation(2,1)-finalRotation(1,2));
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(1,1)-
            finalRotation(1,0)*finalRotation(0,1)-finalRotation(2,2));

        //check if the initial constraints are fullfilled to a sufficient extend
        if( totalEval < 0.001 )
        {
          Eigen::Matrix<double,3,5> normalVectors;
          normalVectors.col(0) = f1.col(0).cross(finalRotation * f2.col(0));
          normalVectors.col(1) = f1.col(1).cross(finalRotation * f2.col(1));
          normalVectors.col(2) = f1.col(2).cross(finalRotation * f2.col(2));
          normalVectors.col(3) = f1.col(3).cross(finalRotation * f2.col(3));
          normalVectors.col(4) = f1.col(4).cross(finalRotation * f2.col(4));

          Eigen::Vector3d trans01 =
              normalVectors.col(0).cross(normalVectors.col(1));
          Eigen::Vector3d trans02 =
              normalVectors.col(0).cross(normalVectors.col(2));
          Eigen::Vector3d trans03 =
              normalVectors.col(0).cross(normalVectors.col(3));
          Eigen::Vector3d trans04 =
              normalVectors.col(0).cross(normalVectors.col(4));
          Eigen::Vector3d trans12 =
              normalVectors.col(1).cross(normalVectors.col(2));
          Eigen::Vector3d trans13 =
              normalVectors.col(1).cross(normalVectors.col(3));
          Eigen::Vector3d trans14 =
              normalVectors.col(1).cross(normalVectors.col(4));
          Eigen::Vector3d trans23 =
              normalVectors.col(2).cross(normalVectors.col(3));
          Eigen::Vector3d trans24 =
              normalVectors.col(2).cross(normalVectors.col(4));
          Eigen::Vector3d trans34 =
              normalVectors.col(3).cross(normalVectors.col(4));

          Eigen::Vector3d tempVector1;
          Eigen::Vector3d tempVector2;

          bool positive = true;

          for( int i = 0; i < 5; i++ )
          {
            tempVector1 = trans01.cross( f1.col(i) );
            tempVector2 = trans01.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans02.cross( f1.col(i) );
            tempVector2 = trans02.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans03.cross( f1.col(i) );
            tempVector2 = trans03.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans04.cross( f1.col(i) );
            tempVector2 = trans04.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans12.cross( f1.col(i) );
            tempVector2 = trans12.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans13.cross( f1.col(i) );
            tempVector2 = trans13.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans14.cross( f1.col(i) );
            tempVector2 = trans14.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans23.cross( f1.col(i) );
            tempVector2 = trans23.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans24.cross( f1.col(i) );
            tempVector2 = trans24.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans34.cross( f1.col(i) );
            tempVector2 = trans34.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
          }

          //finally, check if the cheiriality constraint is fullfilled to
          //sufficient extend
          if( positive )
            rotations.push_back(finalRotation);
        }
      }
    }
  }
}